

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::initBasic(Value *this,ValueType type,bool allocated)

{
  bool allocated_local;
  ValueType type_local;
  Value *this_local;
  
  *(ushort *)&this->field_0x8 = *(ushort *)&this->field_0x8 & 0xff00 | (ushort)type & 0xff;
  *(ushort *)&this->field_0x8 = *(ushort *)&this->field_0x8 & 0xfeff | (ushort)allocated << 8;
  this->comments_ = (CommentInfo *)0x0;
  this->start_ = 0;
  this->limit_ = 0;
  return;
}

Assistant:

void Value::initBasic(ValueType type, bool allocated) {
  type_ = type;
  allocated_ = allocated;
#ifdef JSON_VALUE_USE_INTERNAL_MAP
  itemIsUsed_ = 0;
#endif
  comments_ = 0;
  start_ = 0;
  limit_ = 0;
}